

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O0

void __thiscall json::Value::unescapeIntoWTF16(Value *this,char *str)

{
  string local_1e0;
  IString local_1c0 [2];
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [376];
  char *local_18;
  char *str_local;
  Value *this_local;
  
  local_18 = str;
  str_local = (char *)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  ::wasm::String::unescapeUTF8JSONtoWTF16(local_190,local_18);
  std::__cxx11::stringstream::str();
  ::wasm::IString::IString(local_1c0,&local_1e0);
  setString(this,local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return;
}

Assistant:

void unescapeIntoWTF16(char* str) {
    // TODO: Optimize the unescaped path? But it is impossible to avoid an
    //       allocation here.
    std::stringstream ss;
    wasm::String::unescapeUTF8JSONtoWTF16(ss, str);
    // TODO: Use ss.view() once we have C++20.
    setString(ss.str());
  }